

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_ptr.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  size_t in_R8;
  long lVar2;
  ulong uVar3;
  reference rVar4;
  GlobalPtr<int> dst;
  GlobalPtr<char> dst_00;
  GlobalPtr<int> dst_01;
  GlobalPtr<const_int> src;
  vector<int,_std::allocator<int>_> zeros;
  allocator_type local_59;
  GlobalPtr<int> local_58;
  value_type_conflict local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  BCL::init((BCL *)0x100,(EVP_PKEY_CTX *)0x0);
  if (1 < BCL::my_nprocs) {
    local_58 = (GlobalPtr<int>)ZEXT816(0);
    if (BCL::my_rank == 0) {
      local_58 = BCL::local_malloc<int>(BCL::my_nprocs);
    }
    local_58 = BCL::broadcast<BCL::GlobalPtr<int>>(&local_58,0);
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_58.rank;
    local_3c = (value_type_conflict)BCL::my_rank;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(local_58.ptr + BCL::my_rank * 4);
    rVar4 = BCL::GlobalPtr<int>::operator*((GlobalPtr<int> *)&local_38);
    dst.rank = rVar4.ptr_.ptr;
    dst.ptr = 1;
    BCL::write<int>((BCL *)&local_3c,(int *)rVar4.ptr_.rank,dst,in_R8);
    BCL::barrier();
    if (BCL::my_rank == 0) {
      piVar1 = BCL::GlobalPtr<int>::local(&local_58);
      puts("Rank 0 Sees:");
      if (BCL::my_nprocs != 0) {
        uVar3 = 0;
        do {
          printf("%lu: %d\n",uVar3,(ulong)(uint)piVar1[uVar3]);
          uVar3 = uVar3 + 1;
        } while (uVar3 < BCL::my_nprocs);
      }
    }
    BCL::barrier();
    if (BCL::my_rank == 1) {
      local_3c = 0;
      std::vector<int,_std::allocator<int>_>::vector(&local_38,BCL::my_nprocs,&local_3c,&local_59);
      dst_00.ptr = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      dst_00.rank = local_58.ptr;
      BCL::write<char>((BCL *)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,(char *)local_58.rank,dst_00,in_R8);
      if ((BCL *)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (BCL *)0x0) {
        operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    BCL::barrier();
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,(int)BCL::my_rank);
    dst_01.rank = BCL::my_rank * 4 + local_58.ptr;
    dst_01.ptr = 1;
    BCL::write<int>((BCL *)&local_38,(int *)local_58.rank,dst_01,in_R8);
    BCL::barrier();
    if (BCL::my_rank == 1) {
      puts("Rank 1 Sees:");
      if (BCL::my_nprocs != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          src.rank = local_58.ptr + lVar2;
          src.ptr = (size_t)&local_38;
          BCL::read<int>((BCL *)local_58.rank,src,(int *)0x1,in_R8);
          printf("%lu: %d\n",uVar3,
                 (ulong)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff);
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 4;
        } while (uVar3 < BCL::my_nprocs);
      }
    }
    BCL::finalize();
    return 0;
  }
  __assert_fail("BCL::nprocs() >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/berkeley-container-library[P]bcl/examples/simple/global_ptr.cpp"
                ,0x22,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  BCL::init();

  // Need to run this with at least two processes.
  assert(BCL::nprocs() >= 2);

  BCL::GlobalPtr<int> ptr = nullptr;

  if (BCL::rank() == 0) {
    ptr = BCL::alloc<int>(BCL::nprocs());
  }

  ptr = BCL::broadcast(ptr, 0);

  // 1) Using pointer dereference
  //    to write a value.
  ptr[BCL::rank()] = BCL::rank();

  BCL::barrier();

  if (BCL::rank() == 0) {
    // 2) Calling .local() to get a local pointer.
    int* local = ptr.local();

    printf("Rank 0 Sees:\n");
    for (size_t i = 0; i < BCL::nprocs(); i++) {
      printf("%lu: %d\n", i, local[i]);
    }
  }

  BCL::barrier();

  if (BCL::rank() == 1) {
    std::vector<int> zeros(BCL::nprocs(), 0);
    // 3) Using BCL::memcpy.
    BCL::memcpy(ptr, zeros.data(), sizeof(int)*zeros.size());
  }

  BCL::barrier();

  // 4) Using rput
  BCL::rput((int) BCL::rank(), ptr + BCL::rank());

  BCL::barrier();

  if (BCL::rank() == 1) {
    printf("Rank 1 Sees:\n");
    for (size_t i = 0; i < BCL::nprocs(); i++) {
      // 4) Using rget
      printf("%lu: %d\n", i, BCL::rget(ptr + i));
    }
  }

  BCL::finalize();
  return 0;
}